

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O2

Value * __thiscall
wabt::Decompiler::DecompileExpr(Value *__return_storage_ptr__,Decompiler *this,Node *n,Node *parent)

{
  Value *this_00;
  char cVar1;
  ExprType EVar2;
  Opcode OVar3;
  pointer pNVar4;
  long lVar5;
  AST *pAVar6;
  Node *pNVar7;
  uint64_t uVar8;
  Address AVar9;
  pointer args_00;
  pointer pVVar10;
  const_iterator cVar11;
  string_view postfix;
  string_view postfix_00;
  string_view postfix_01;
  string_view postfix_02;
  string_view postfix_03;
  string_view postfix_04;
  string *psVar12;
  mapped_type *pmVar13;
  OpcodeExpr<(wabt::ExprType)7> *pOVar14;
  Type TVar15;
  LoadStoreExpr<(wabt::ExprType)49> *pLVar16;
  VarExpr<(wabt::ExprType)24> *ve;
  VarExpr<(wabt::ExprType)21> *ve_00;
  OpcodeExpr<(wabt::ExprType)63> *pOVar17;
  LoadStoreExpr<(wabt::ExprType)23> *pLVar18;
  VarExpr<(wabt::ExprType)9> *pVVar19;
  CodeMetadataExpr *pCVar20;
  IfExpr *pIVar21;
  size_t sVar22;
  size_t sVar23;
  BlockExprBase<(wabt::ExprType)8> *pBVar24;
  OpcodeExpr<(wabt::ExprType)16> *pOVar25;
  ConstExpr *pCVar26;
  VarExpr<(wabt::ExprType)25> *ve_01;
  VarExpr<(wabt::ExprType)26> *ve_02;
  VarExpr<(wabt::ExprType)10> *pVVar27;
  BrTableExpr *pBVar28;
  VarExpr<(wabt::ExprType)20> *ve_03;
  BlockExprBase<(wabt::ExprType)27> *pBVar29;
  VarExpr<(wabt::ExprType)12> *pVVar30;
  VarExpr<(wabt::ExprType)40> *pVVar31;
  OpcodeExpr<(wabt::ExprType)58> *pOVar32;
  uint *args_1;
  size_t sVar33;
  pointer pVVar34;
  Index i;
  uint uVar35;
  long lVar36;
  Node *c;
  pointer n_00;
  char (*in_R8) [4];
  char *pcVar37;
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  Var *v;
  pointer this_01;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __result;
  size_t i_1;
  ulong uVar39;
  bool bVar40;
  string_view prefix;
  string_view prefix_00;
  string_view prefix_01;
  string_view prefix_02;
  string_view infix;
  string_view prefix_03;
  string_view y;
  string_view y_00;
  string_view prefix_04;
  string_view first_indent;
  string_view prefix_05;
  string_view infix_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view sVar41;
  size_t sStackY_1b0;
  Precedence PVar42;
  undefined4 uVar43;
  undefined4 uVar44;
  undefined4 uVar45;
  undefined4 uVar46;
  string decls;
  undefined1 local_178 [8];
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_170;
  string_view local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_> args;
  char *jmp;
  pointer pbStack_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  Value *local_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  char *pcStack_d0;
  undefined8 local_c8;
  char *pcStack_c0;
  undefined8 local_b8;
  char *pcStack_b0;
  size_type local_a8;
  pointer pcStack_a0;
  undefined8 local_98;
  char *pcStack_90;
  undefined8 local_88;
  char *pcStack_80;
  undefined8 local_78;
  char *pcStack_70;
  undefined8 local_68;
  char *pcStack_60;
  undefined8 local_58;
  char *pcStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  _Alloc_hider _Var38;
  
  args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  pNVar4 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
           super__Vector_impl_data._M_finish;
  n_00 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
         super__Vector_impl_data._M_start;
  local_170.container = &__return_storage_ptr__->v;
  for (; pVVar34 = args.
                   super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                   ._M_impl.super__Vector_impl_data._M_start,
      __result.container = local_170.container, n_00 != pNVar4; n_00 = n_00 + 1) {
    DecompileExpr((Value *)&decls,this,n_00,n);
    std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::
    emplace_back<wabt::Decompiler::Value>(&args,(Value *)&decls);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&decls);
  }
  args_1 = &switchD_00153b72::switchdataD_001d8644;
  switch(n->ntype) {
  case Uninitialized:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/decompiler.cc"
                  ,0x19e,"Value wabt::Decompiler::DecompileExpr(const Node &, const Node *)");
  case FlushToVars:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decls,"let ",(allocator<char> *)&local_168);
    for (uVar35 = 0; uVar35 < (n->u).field_0.var_count; uVar35 = uVar35 + 1) {
      if (uVar35 != 0) {
        std::__cxx11::string::append((char *)&decls);
      }
      TempVarName_abi_cxx11_((string *)&local_168,this,(n->u).field_0.var_start + uVar35);
      std::__cxx11::string::append((string *)&decls);
      std::__cxx11::string::_M_dispose();
    }
    std::__cxx11::string::append((char *)&decls);
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_170;
    local_58 = 0;
    pcStack_50 = "";
    postfix_00._M_str._4_4_ = 0;
    postfix_00._0_12_ = ZEXT412(0x1d8897) << 0x40;
    prefix_00._M_str = decls._M_dataplus._M_p;
    prefix_00._M_len = decls._M_string_length;
    WrapNAry((Value *)local_170.container,this,&args,prefix_00,postfix_00,Assign);
    goto LAB_00153ed3;
  case FlushedVar:
    TempVarName_abi_cxx11_(&decls,this,(n->u).field_0.var_start);
    goto LAB_00153d93;
  case Statements:
    decls._M_dataplus._M_p = (pointer)0x0;
    decls._M_string_length = 0;
    decls.field_2._M_allocated_capacity = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(local_170.container,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&decls);
    *(undefined4 *)
     &__result.container[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&decls);
    lVar36 = 8;
    for (uVar39 = 0;
        uVar39 < (ulong)(((long)(n->children).
                                super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(n->children).
                               super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0x30); uVar39 = uVar39 + 1) {
      lVar5 = *(long *)((long)&((args.
                                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->v).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar36);
      cVar1 = *(char *)(*(long *)(lVar5 + -0x20) + -1 + *(long *)(lVar5 + -0x18));
      if ((cVar1 != ':') && (cVar1 != '}')) {
        std::__cxx11::string::push_back((char)lVar5 + -0x20);
      }
      std::__copy_move<true,false,std::random_access_iterator_tag>::
      __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)args.
                         super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar36 + -8),
                 *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                  ((long)&((args.
                            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                            ._M_impl.super__Vector_impl_data._M_start)->v).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar36),__result);
      lVar36 = lVar36 + 0x20;
    }
    goto LAB_00153ed8;
  case EndReturn:
    local_68 = 0;
    pcStack_60 = "";
LAB_00153cc4:
    pcVar37 = "return ";
    sStackY_1b0 = 7;
LAB_00153cd6:
    postfix._M_str._4_4_ = 0;
    postfix._0_12_ = ZEXT412(0x1d8897) << 0x40;
    prefix._M_str = pcVar37;
    prefix._M_len = sStackY_1b0;
    WrapNAry((Value *)local_170.container,this,&args,prefix,postfix,None);
    goto LAB_00153ed8;
  case Decl:
    pAVar6 = this->cur_ast;
    psVar12 = Var::name_abi_cxx11_((n->u).var);
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&pAVar6->vars_defined,psVar12);
    pmVar13->defined = true;
    psVar12 = Var::name_abi_cxx11_((n->u).var);
    std::__cxx11::string::string((string *)&jmp,(string *)psVar12);
    TVar15 = Func::GetLocalType(this->cur_func,(n->u).var);
    LocalDecl((string *)&local_168,this,(string *)&jmp,TVar15);
    std::operator+(&decls,"var ",(string *)&local_168);
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,&decls
               ,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__result.container,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_48);
    *(undefined4 *)
     &__result.container[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_48);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    goto LAB_00153ed3;
  case DeclInit:
    pAVar6 = this->cur_ast;
    psVar12 = Var::name_abi_cxx11_((n->u).var);
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::AST::Variable>_>_>
              ::operator[](&pAVar6->vars_defined,psVar12);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (pmVar13->defined == true) {
      psVar12 = Var::name_abi_cxx11_((n->u).var);
      name._M_str = (psVar12->_M_dataplus)._M_p;
      name._M_len = psVar12->_M_string_length;
      local_168 = VarName(this,name);
      cat<std::basic_string_view<char,std::char_traits<char>>,char[4]>
                (&decls,(wabt *)&local_168,
                 (basic_string_view<char,_std::char_traits<char>_> *)0x1e5cd7,(char (*) [4])args_1);
      local_78 = 0;
      pcStack_70 = "";
      postfix_01._M_str._4_4_ = 0;
      postfix_01._0_12_ = ZEXT412(0x1d8897) << 0x40;
      prefix_01._M_str = decls._M_dataplus._M_p;
      prefix_01._M_len = decls._M_string_length;
      WrapChild((Value *)__result.container,this,pVVar34,prefix_01,postfix_01,None);
    }
    else {
      psVar12 = Var::name_abi_cxx11_((n->u).var);
      std::__cxx11::string::string((string *)&jmp,(string *)psVar12);
      TVar15 = Func::GetLocalType(this->cur_func,(n->u).var);
      LocalDecl((string *)&local_168,this,(string *)&jmp,TVar15);
      cat<char[5],std::__cxx11::string,char[4]>
                (&decls,(wabt *)"var ",(char (*) [5])&local_168,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e5cd7,in_R8
                );
      local_88 = 0;
      pcStack_80 = "";
      postfix_02._M_str._4_4_ = 0;
      postfix_02._0_12_ = ZEXT412(0x1d8897) << 0x40;
      prefix_02._M_str = decls._M_dataplus._M_p;
      prefix_02._M_len = decls._M_string_length;
      WrapChild((Value *)local_170.container,this,pVVar34,prefix_02,postfix_02,None);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      __result.container =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_170;
    }
    goto LAB_00153ed3;
  }
  EVar2 = n->etype;
  switch(EVar2) {
  case Binary:
    pOVar14 = cast<wabt::OpcodeExpr<(wabt::ExprType)7>,wabt::Expr>(n->e);
    OpcodeToToken_abi_cxx11_(&decls,this,(Opcode)(pOVar14->opcode).enum_);
    bVar40 = std::operator==(&decls,"*");
    PVar42 = Multiply;
    if (((!bVar40) && (bVar40 = std::operator==(&decls,"/"), !bVar40)) &&
       (bVar40 = std::operator==(&decls,"%"), !bVar40)) {
      bVar40 = std::operator==(&decls,"+");
      PVar42 = Add;
      if ((!bVar40) && (bVar40 = std::operator==(&decls,"-"), !bVar40)) {
        bVar40 = std::operator==(&decls,"&");
        PVar42 = Bit;
        if ((!bVar40) &&
           ((bVar40 = std::operator==(&decls,"|"), !bVar40 &&
            (bVar40 = std::operator==(&decls,"^"), !bVar40)))) {
          bVar40 = std::operator==(&decls,"<<");
          if ((bVar40) || (bVar40 = std::operator==(&decls,">>"), bVar40)) {
            PVar42 = Shift;
            __result.container =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_170;
          }
          else {
            PVar42 = OtherBin;
            __result.container =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_170;
          }
        }
      }
    }
    goto LAB_00154f59;
  case Block:
    pBVar24 = cast<wabt::BlockExprBase<(wabt::ExprType)8>,wabt::Expr>(n->e);
    name_01._M_str = (pBVar24->block).label._M_dataplus._M_p;
    name_01._M_len = (pBVar24->block).label._M_string_length;
    local_168 = VarName(this,name_01);
    cat<char[7],std::basic_string_view<char,std::char_traits<char>>,char[2]>
              (&decls,(wabt *)"label ",(char (*) [7])&local_168,
               (basic_string_view<char,_std::char_traits<char>_> *)":",(char (*) [2])&local_168);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pVVar34,&decls);
    std::__cxx11::string::_M_dispose();
    if (((((parent != (Node *)0x0) && (parent->ntype != Statements)) &&
         (EVar2 = parent->etype, EVar2 != Block)) && (EVar2 != Loop)) &&
       ((EVar2 != If ||
        ((parent->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
         super__Vector_impl_data._M_start == n)))) {
      IndentValue(this,pVVar34,this->indent_amount,(string_view)ZEXT816(0));
      cVar11._M_current =
           (pVVar34->v).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&decls,"{",(allocator<char> *)&local_168);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_insert_rval(&pVVar34->v,cVar11,&decls);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&decls,"}",(allocator<char> *)&local_168);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pVVar34,&decls
                );
      std::__cxx11::string::_M_dispose();
    }
    pVVar34->precedence = Atomic;
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_170;
    goto LAB_00154bb0;
  case Br:
    pVVar19 = cast<wabt::VarExpr<(wabt::ExprType)9>,wabt::Expr>(n->e);
    pcVar37 = "goto ";
    if ((n->u).field_0.var_start == 3) {
      pcVar37 = "continue ";
    }
    psVar12 = Var::name_abi_cxx11_(&pVVar19->var);
    name_00._M_str = (psVar12->_M_dataplus)._M_p;
    name_00._M_len = psVar12->_M_string_length;
    sVar41 = VarName(this,name_00);
    y._M_str = *in_R8;
    y._M_len = (size_t)sVar41._M_str;
    operator+[abi_cxx11_(&decls,(wabt *)pcVar37,(char *)sVar41._M_len,y);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               &decls,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__result.container,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    *(undefined4 *)
     &__result.container[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
    goto LAB_00153ed3;
  case BrIf:
    pVVar27 = cast<wabt::VarExpr<(wabt::ExprType)10>,wabt::Expr>(n->e);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    jmp = "goto";
    if ((n->u).field_0.var_start == 3) {
      jmp = "continue";
    }
    psVar12 = Var::name_abi_cxx11_(&pVVar27->var);
    name_02._M_str = (psVar12->_M_dataplus)._M_p;
    name_02._M_len = psVar12->_M_string_length;
    local_168 = VarName(this,name_02);
    cat<char[3],char_const*,char[2],std::basic_string_view<char,std::char_traits<char>>>
              (&decls,(wabt *)0x1e8680,(char (*) [3])&jmp,(char **)0x1d8994,(char (*) [2])&local_168
               ,in_R9);
    local_a8 = decls._M_string_length;
    pcStack_a0 = decls._M_dataplus._M_p;
    uVar43 = (undefined4)decls._M_string_length;
    uVar44 = (undefined4)(decls._M_string_length >> 0x20);
    uVar45 = SUB84(decls._M_dataplus._M_p,0);
    uVar46 = (undefined4)((ulong)decls._M_dataplus._M_p >> 0x20);
    sVar33 = 4;
    PVar42 = None;
    _Var38._M_p = "if (";
    goto LAB_00154933;
  case BrTable:
    pBVar28 = cast<wabt::BrTableExpr,wabt::Expr>(n->e);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decls,"br_table[",(allocator<char> *)&local_168);
    pVVar10 = (pBVar28->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (this_01 = (pBVar28->targets).super__Vector_base<wabt::Var,_std::allocator<wabt::Var>_>.
                   _M_impl.super__Vector_impl_data._M_start; this_01 != pVVar10;
        this_01 = this_01 + 1) {
      psVar12 = Var::name_abi_cxx11_(this_01);
      name_03._M_str = (psVar12->_M_dataplus)._M_p;
      name_03._M_len = psVar12->_M_string_length;
      sVar41 = VarName(this,name_03);
      std::__cxx11::string::append((char *)&decls,(ulong)sVar41._M_str);
      std::__cxx11::string::append((char *)&decls);
    }
    std::__cxx11::string::append((char *)&decls);
    psVar12 = Var::name_abi_cxx11_(&pBVar28->default_target);
    name_04._M_str = (psVar12->_M_dataplus)._M_p;
    name_04._M_len = psVar12->_M_string_length;
    sVar41 = VarName(this,name_04);
    std::__cxx11::string::append((char *)&decls,(ulong)sVar41._M_str);
    std::__cxx11::string::append((char *)&decls);
    local_d8 = 1;
    pcStack_d0 = ")";
    uVar43 = 1;
    uVar44 = 0;
    uVar45 = 0x1dc487;
    uVar46 = 0;
    PVar42 = Atomic;
    sVar33 = decls._M_string_length;
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    _Var38 = decls._M_dataplus;
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_170;
LAB_00154933:
    postfix_03._M_len._4_4_ = uVar44;
    postfix_03._M_len._0_4_ = uVar43;
    postfix_03._M_str._0_4_ = uVar45;
    postfix_03._M_str._4_4_ = uVar46;
    prefix_04._M_str = _Var38._M_p;
    prefix_04._M_len = sVar33;
    WrapChild((Value *)__result.container,this,pVVar34,prefix_04,postfix_03,PVar42);
    goto LAB_00153ed3;
  default:
    decls._M_dataplus._M_p = (pointer)&decls.field_2;
    decls._M_string_length = 0;
    decls.field_2._M_allocated_capacity = decls.field_2._M_allocated_capacity & 0xffffffffffffff00;
    switch(EVar2) {
    case MemoryCopy:
      break;
    case DataDrop:
    case MemoryInit:
    case Nop:
    case RefFunc:
    case RefNull:
    case Rethrow:
    case Return:
switchD_00154ab4_caseD_1d:
      GetExprTypeName(EVar2);
      break;
    case MemoryFill:
      break;
    case MemoryGrow:
      break;
    case MemorySize:
      break;
    case RefIsNull:
      break;
    case ReturnCall:
      pVVar31 = cast<wabt::VarExpr<(wabt::ExprType)40>,wabt::Expr>(n->e);
      psVar12 = Var::name_abi_cxx11_(&pVVar31->var);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168
                     ,"return_call ",psVar12);
      std::__cxx11::string::operator=((string *)&decls,(string *)&local_168);
      std::__cxx11::string::_M_dispose();
      PVar42 = None;
      goto LAB_00154e9f;
    case ReturnCallIndirect:
      break;
    case Select:
      break;
    default:
      if (EVar2 == Ternary) {
        pOVar32 = cast<wabt::OpcodeExpr<(wabt::ExprType)58>,wabt::Expr>(n->e);
LAB_00154f15:
        OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)(pOVar32->opcode).enum_);
        std::__cxx11::string::operator=((string *)&decls,(string *)&local_168);
        std::__cxx11::string::_M_dispose();
      }
      else {
        if (EVar2 == CallIndirect) break;
        if (EVar2 == Convert) {
          pOVar32 = (OpcodeExpr<(wabt::ExprType)58> *)
                    cast<wabt::OpcodeExpr<(wabt::ExprType)18>,wabt::Expr>(n->e);
          goto LAB_00154f15;
        }
        if (EVar2 != Call) goto switchD_00154ab4_caseD_1d;
        pVVar30 = cast<wabt::VarExpr<(wabt::ExprType)12>,wabt::Expr>(n->e);
        Var::name_abi_cxx11_(&pVVar30->var);
        std::__cxx11::string::_M_assign((string *)&decls);
      }
      goto LAB_00154e9c;
    }
    std::__cxx11::string::assign((char *)&decls);
LAB_00154e9c:
    PVar42 = Atomic;
LAB_00154e9f:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168,
                   &decls,"(");
    local_e8 = 1;
    pcStack_e0 = ")";
    postfix_04._M_str._0_4_ = 0x1dc487;
    postfix_04._M_len = 1;
    postfix_04._M_str._4_4_ = 0;
    prefix_05._M_str = (char *)local_168._M_len;
    prefix_05._M_len = (size_t)local_168._M_str;
    WrapNAry((Value *)__result.container,this,&args,prefix_05,postfix_04,PVar42);
    goto LAB_00154eff;
  case CodeMetadata:
    pCVar20 = cast<wabt::CodeMetadataExpr,wabt::Expr>(n->e);
    y_00._M_str = *in_R8;
    y_00._M_len = (size_t)(pCVar20->name)._M_str;
    operator+[abi_cxx11_
              ((string *)&local_168,(wabt *)"// @metadata.code.",(char *)(pCVar20->name)._M_len,y_00
              );
    std::operator+(&decls,(string *)&local_168," ");
    std::__cxx11::string::_M_dispose();
    BinaryToString_abi_cxx11_((string *)&local_168,this,&pCVar20->data);
    std::__cxx11::string::append((string *)&decls);
    std::__cxx11::string::_M_dispose();
    local_168._M_str = (char *)decls._M_string_length;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)decls._M_dataplus._M_p == &decls.field_2) {
      local_158._8_8_ = decls.field_2._8_8_;
      decls._M_dataplus._M_p = (pointer)&local_158;
    }
    local_158._M_allocated_capacity = decls.field_2._M_allocated_capacity;
    decls._M_string_length = 0;
    local_168._M_len = (size_t)decls._M_dataplus._M_p;
    decls.field_2._M_allocated_capacity = decls.field_2._M_allocated_capacity & 0xffffffffffffff00;
    jmp = (char *)0x0;
    pbStack_110 = (pointer)0x0;
    local_108._M_allocated_capacity = 0;
    decls._M_dataplus._M_p = (pointer)&decls.field_2;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&jmp,
               (string *)&local_168);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__result.container,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&jmp);
    *(undefined4 *)
     &__result.container[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
LAB_00154ddb:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&jmp);
LAB_00154de6:
    std::__cxx11::string::_M_dispose();
    goto LAB_00153ed3;
  case Compare:
    pOVar25 = cast<wabt::OpcodeExpr<(wabt::ExprType)16>,wabt::Expr>(n->e);
    OpcodeToToken_abi_cxx11_(&decls,this,(Opcode)(pOVar25->opcode).enum_);
    PVar42 = Equal;
LAB_00154f59:
    infix_00._M_str = decls._M_dataplus._M_p;
    infix_00._M_len = decls._M_string_length;
    WrapBinary((Value *)__result.container,this,&args,infix_00,false,PVar42);
    goto LAB_00153ed3;
  case Const:
    pCVar26 = cast<wabt::ConstExpr,wabt::Expr>(n->e);
    switch((pCVar26->const_).type_.enum_) {
    case V128:
      pcVar37 = "V128";
      goto LAB_001540fb;
    case F64:
      to_string_abi_cxx11_(&decls,this,*(double *)(pCVar26->const_).data_.v);
      break;
    case F32:
      to_string_abi_cxx11_((string *)&local_168,this,(double)*(float *)(pCVar26->const_).data_.v);
      std::operator+(&decls,(string *)&local_168,"f");
      jmp = (char *)0x0;
      pbStack_110 = (pointer)0x0;
      local_108._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&jmp,&decls,
                 local_178);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__result.container,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&jmp);
      *(undefined4 *)
       &__result.container[1].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 10;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&jmp);
      goto LAB_00154eff;
    case I64:
      std::__cxx11::to_string((string *)&local_168,*(long *)(pCVar26->const_).data_.v);
      std::operator+(&decls,(string *)&local_168,"L");
      jmp = (char *)0x0;
      pbStack_110 = (pointer)0x0;
      local_108._M_allocated_capacity = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&jmp,&decls,
                 local_178);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(__result.container,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&jmp);
      *(undefined4 *)
       &__result.container[1].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = 10;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&jmp);
      goto LAB_00154de6;
    case I32:
      std::__cxx11::to_string(&decls,*(int *)(pCVar26->const_).data_.v);
      break;
    default:
      abort();
    }
    goto LAB_00153d93;
  case Drop:
    goto switchD_00153f1a_caseD_13;
  case GlobalGet:
    ve_03 = cast<wabt::VarExpr<(wabt::ExprType)20>,wabt::Expr>(n->e);
    Get<(wabt::ExprType)20>((Value *)__result.container,this,ve_03);
    break;
  case GlobalSet:
    ve_00 = cast<wabt::VarExpr<(wabt::ExprType)21>,wabt::Expr>(n->e);
    Set<(wabt::ExprType)21>((Value *)__result.container,this,pVVar34,ve_00);
    break;
  case If:
    pIVar21 = cast<wabt::IfExpr,wabt::Expr>(n->e);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    sVar33 = (pIVar21->false_).size_;
    local_f0 = args.
               super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
    bVar40 = true;
    if ((ulong)((long)((args.
                        super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start)->v).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)((args.
                       super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                       ._M_impl.super__Vector_impl_data._M_start)->v).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      bVar40 = 0x20 < (ulong)((long)args.
                                    super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start[1].v.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)args.
                                   super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start[1].v.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
    }
    this_00 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start + 2;
    sVar22 = Value::width(args.
                          super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    sVar23 = Value::width(local_f0);
    uVar39 = sVar23 + sVar22;
    if (sVar33 == 0) {
LAB_001544c2:
      if ((!bVar40) && (uVar39 <= this->target_exp_width)) {
        cat<char[5],std::__cxx11::string,char[4]>
                  (&decls,(wabt *)"if (",
                   (char (*) [5])
                   (pVVar34->v).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") {",in_R8)
        ;
        args_00 = pVVar34[1].v.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (args_00 !=
            pVVar34[1].v.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          cat<char[2],std::__cxx11::string,char[2]>
                    ((string *)&local_168,(wabt *)0x1d8994,(char (*) [2])args_00,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1d8994,
                     (char (*) [2])in_R8);
          std::__cxx11::string::append((string *)&decls);
          std::__cxx11::string::_M_dispose();
        }
        std::__cxx11::string::append((char *)&decls);
        __result.container =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_170;
        if (sVar33 != 0) {
          cat<char[9],std::__cxx11::string,char[3]>
                    ((string *)&local_168,(wabt *)" else { ",
                     (char (*) [9])
                     (this_00->v).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e66c1,
                     (char (*) [3])in_R8);
          std::__cxx11::string::append((string *)&decls);
          std::__cxx11::string::_M_dispose();
        }
        local_168._M_str = (char *)decls._M_string_length;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)decls._M_dataplus._M_p == &decls.field_2) {
          local_158._8_8_ = decls.field_2._8_8_;
          decls._M_dataplus._M_p = (pointer)&local_158;
        }
        local_158._M_allocated_capacity = decls.field_2._M_allocated_capacity;
        decls._M_string_length = 0;
        local_168._M_len = (size_t)decls._M_dataplus._M_p;
        decls.field_2._M_allocated_capacity =
             decls.field_2._M_allocated_capacity & 0xffffffffffffff00;
        jmp = (char *)0x0;
        pbStack_110 = (pointer)0x0;
        local_108._M_allocated_capacity = 0;
        decls._M_dataplus._M_p = (pointer)&decls.field_2;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_initialize<std::__cxx11::string_const*>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&jmp,
                   (string *)&local_168);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(__result.container,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&jmp);
        *(Precedence *)((long)__result.container + 0x18) = If;
        goto LAB_00154ddb;
      }
    }
    else {
      sVar22 = Value::width(this_00);
      if (!bVar40) {
        uVar39 = uVar39 + sVar22;
        bVar40 = 0x20 < (ulong)((long)pVVar34[2].v.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)pVVar34[2].v.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start);
        goto LAB_001544c2;
      }
    }
    first_indent._M_str = "if (";
    first_indent._M_len = 4;
    IndentValue(this,pVVar34,4,first_indent);
    std::__cxx11::string::append
              ((char *)((pVVar34->v).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1));
    IndentValue(this,local_f0,this->indent_amount,(string_view)ZEXT816(0));
    std::__copy_move<true,false,std::random_access_iterator_tag>::
    __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              (pVVar34[1].v.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               pVVar34[1].v.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )pVVar34);
    if (sVar33 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&decls,"} else {",(allocator<char> *)&local_168);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pVVar34,&decls
                );
      std::__cxx11::string::_M_dispose();
      IndentValue(this,this_00,this->indent_amount,(string_view)ZEXT816(0));
      std::__copy_move<true,false,std::random_access_iterator_tag>::
      __copy_m<std::__cxx11::string*,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                (pVVar34[2].v.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 pVVar34[2].v.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )pVVar34);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decls,"}",(allocator<char> *)&local_168);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pVVar34,&decls);
    std::__cxx11::string::_M_dispose();
    pVVar34->precedence = If;
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_170;
    goto LAB_00154bb0;
  case Load:
    pLVar18 = cast<wabt::LoadStoreExpr<(wabt::ExprType)23>,wabt::Expr>(n->e);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pNVar7 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = pLVar18->offset;
    OVar3.enum_ = (pLVar18->opcode).enum_;
    AVar9 = pLVar18->align;
    TVar15 = Opcode::GetResultType(&pLVar18->opcode);
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_170;
    LoadStore(this,pVVar34,pNVar7,uVar8,OVar3,AVar9,TVar15);
    goto switchD_00153f1a_caseD_13;
  case LocalGet:
    ve = cast<wabt::VarExpr<(wabt::ExprType)24>,wabt::Expr>(n->e);
    Get<(wabt::ExprType)24>((Value *)__result.container,this,ve);
    break;
  case LocalSet:
    ve_01 = cast<wabt::VarExpr<(wabt::ExprType)25>,wabt::Expr>(n->e);
    Set<(wabt::ExprType)25>((Value *)__result.container,this,pVVar34,ve_01);
    break;
  case LocalTee:
    ve_02 = cast<wabt::VarExpr<(wabt::ExprType)26>,wabt::Expr>(n->e);
    if (args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        args.super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      Get<(wabt::ExprType)26>((Value *)__result.container,this,ve_02);
    }
    else {
      Set<(wabt::ExprType)26>
                ((Value *)__result.container,this,
                 args.
                 super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>
                 ._M_impl.super__Vector_impl_data._M_start,ve_02);
    }
    break;
  case Loop:
    pBVar29 = cast<wabt::BlockExprBase<(wabt::ExprType)27>,wabt::Expr>(n->e);
    IndentValue(this,pVVar34,this->indent_amount,(string_view)ZEXT816(0));
    cVar11._M_current =
         (pVVar34->v).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    name_05._M_str = (pBVar29->block).label._M_dataplus._M_p;
    name_05._M_len = (pBVar29->block).label._M_string_length;
    local_168 = VarName(this,name_05);
    cat<char[6],std::basic_string_view<char,std::char_traits<char>>,char[3]>
              (&decls,(wabt *)"loop ",(char (*) [6])&local_168,
               (basic_string_view<char,_std::char_traits<char>_> *)0x1d4700,(char (*) [3])&local_168
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(&pVVar34->v,cVar11,&decls);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decls,"}",(allocator<char> *)&local_168);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pVVar34,&decls);
    std::__cxx11::string::_M_dispose();
    pVVar34->precedence = Atomic;
LAB_00154bb0:
    Value::Value((Value *)__result.container,pVVar34);
    break;
  case Nop:
    pcVar37 = "nop";
    goto LAB_00154960;
  case RefNull:
    pcVar37 = "null";
LAB_001540fb:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decls,pcVar37,(allocator<char> *)&jmp);
LAB_00153d93:
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               &decls,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__result.container,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    *(undefined4 *)
     &__result.container[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 10;
LAB_00153dc7:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_168);
    goto LAB_00153ed3;
  case Rethrow:
    local_c8 = 0;
    pcStack_c0 = "";
    pcVar37 = "rethrow ";
    sStackY_1b0 = 8;
    goto LAB_00153cd6;
  case Return:
    local_b8 = 0;
    pcStack_b0 = "";
    goto LAB_00153cc4;
  case Store:
    pLVar16 = cast<wabt::LoadStoreExpr<(wabt::ExprType)49>,wabt::Expr>(n->e);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pNVar7 = (n->children).super__Vector_base<wabt::Node,_std::allocator<wabt::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = pLVar16->offset;
    OVar3.enum_ = (pLVar16->opcode).enum_;
    AVar9 = pLVar16->align;
    TVar15 = Opcode::GetParamType2(&pLVar16->opcode);
    __result.container =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_170;
    LoadStore(this,pVVar34,pNVar7,uVar8,OVar3,AVar9,TVar15);
    infix._M_str = "=";
    infix._M_len = 1;
    WrapBinary((Value *)__result.container,this,&args,infix,true,Assign);
    break;
  case Unary:
    pOVar17 = cast<wabt::OpcodeExpr<(wabt::ExprType)63>,wabt::Expr>(n->e);
    pVVar34 = args.
              super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
              _M_impl.super__Vector_impl_data._M_start;
    OpcodeToToken_abi_cxx11_((string *)&local_168,this,(Opcode)(pOVar17->opcode).enum_);
    std::operator+(&decls,(string *)&local_168,"(");
    local_98 = 1;
    pcStack_90 = ")";
    sVar41._M_str._0_4_ = 0x1dc487;
    sVar41._M_len = 1;
    sVar41._M_str._4_4_ = 0;
    prefix_03._M_str = decls._M_dataplus._M_p;
    prefix_03._M_len = decls._M_string_length;
    WrapChild((Value *)__result.container,this,pVVar34,prefix_03,sVar41,Atomic);
LAB_00154eff:
    std::__cxx11::string::_M_dispose();
LAB_00153ed3:
    std::__cxx11::string::_M_dispose();
    break;
  case Last:
    pcVar37 = "unreachable";
LAB_00154960:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&decls,pcVar37,(allocator<char> *)&jmp);
    local_168 = (string_view)ZEXT816(0);
    local_158._M_allocated_capacity = 0;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_range_initialize<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_168,
               &decls,local_178);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__result.container,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_168);
    *(undefined4 *)
     &__result.container[1].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = 0;
    goto LAB_00153dc7;
  }
LAB_00153ed8:
  std::vector<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>::~vector(&args);
  return (Value *)__result.container;
switchD_00153f1a_caseD_13:
  pVVar34 = args.
            super__Vector_base<wabt::Decompiler::Value,_std::allocator<wabt::Decompiler::Value>_>.
            _M_impl.super__Vector_impl_data._M_start;
  goto LAB_00154bb0;
}

Assistant:

Value DecompileExpr(const Node& n, const Node* parent) {
    std::vector<Value> args;
    for (auto& c : n.children) {
      args.push_back(DecompileExpr(c, &n));
    }
    // First deal with the specialized node types.
    switch (n.ntype) {
      case NodeType::FlushToVars: {
        std::string decls = "let ";
        for (Index i = 0; i < n.u.var_count; i++) {
          if (i) {
            decls += ", ";
          }
          decls += TempVarName(n.u.var_start + i);
        }
        decls += " = ";
        return WrapNAry(args, decls, "", Precedence::Assign);
      }
      case NodeType::FlushedVar: {
        return Value{{TempVarName(n.u.var_start)}, Precedence::Atomic};
      }
      case NodeType::Statements: {
        Value stats{{}, Precedence::None};
        for (size_t i = 0; i < n.children.size(); i++) {
          auto& s = args[i].v.back();
          if (s.back() != '}' && s.back() != ':') {
            s += ';';
          }
          std::move(args[i].v.begin(), args[i].v.end(),
                    std::back_inserter(stats.v));
        }
        return stats;
      }
      case NodeType::EndReturn: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case NodeType::Decl: {
        cur_ast->vars_defined[n.u.var->name()].defined = true;
        return Value{{"var " + LocalDecl(std::string(n.u.var->name()),
                                         cur_func->GetLocalType(*n.u.var))},
                     Precedence::None};
      }
      case NodeType::DeclInit: {
        if (cur_ast->vars_defined[n.u.var->name()].defined) {
          // This has already been pre-declared, output as assign.
          return WrapChild(args[0], cat(VarName(n.u.var->name()), " = "), "",
                           Precedence::None);
        } else {
          return WrapChild(args[0],
                           cat("var ",
                               LocalDecl(std::string(n.u.var->name()),
                                         cur_func->GetLocalType(*n.u.var)),
                               " = "),
                           "", Precedence::None);
        }
      }
      case NodeType::Expr:
        // We're going to fall thru to the second switch to deal with ExprType.
        break;
      case NodeType::Uninitialized:
        assert(false);
        break;
    }
    // Existing ExprTypes.
    switch (n.etype) {
      case ExprType::Const: {
        auto& c = cast<ConstExpr>(n.e)->const_;
        switch (c.type()) {
          case Type::I32:
            return Value{{std::to_string(static_cast<int32_t>(c.u32()))},
                         Precedence::Atomic};
          case Type::I64:
            return Value{{std::to_string(static_cast<int64_t>(c.u64())) + "L"},
                         Precedence::Atomic};
          case Type::F32: {
            float f = Bitcast<float>(c.f32_bits());
            return Value{{to_string(f) + "f"}, Precedence::Atomic};
          }
          case Type::F64: {
            double d = Bitcast<double>(c.f64_bits());
            return Value{{to_string(d)}, Precedence::Atomic};
          }
          case Type::V128:
            return Value{{"V128"}, Precedence::Atomic};  // FIXME
          default:
            WABT_UNREACHABLE;
        }
      }
      case ExprType::LocalGet: {
        return Get(*cast<LocalGetExpr>(n.e));
      }
      case ExprType::GlobalGet: {
        return Get(*cast<GlobalGetExpr>(n.e));
      }
      case ExprType::LocalSet: {
        return Set(args[0], *cast<LocalSetExpr>(n.e));
      }
      case ExprType::GlobalSet: {
        return Set(args[0], *cast<GlobalSetExpr>(n.e));
      }
      case ExprType::LocalTee: {
        auto& te = *cast<LocalTeeExpr>(n.e);
        return args.empty() ? Get(te) : Set(args[0], te);
      }
      case ExprType::Binary: {
        auto& be = *cast<BinaryExpr>(n.e);
        auto opcs = OpcodeToToken(be.opcode);
        // TODO: Is this selection better done on Opcode values directly?
        // What if new values get added and OtherBin doesn't make sense?
        auto prec = Precedence::OtherBin;
        if (opcs == "*" || opcs == "/" || opcs == "%") {
          prec = Precedence::Multiply;
        } else if (opcs == "+" || opcs == "-") {
          prec = Precedence::Add;
        } else if (opcs == "&" || opcs == "|" || opcs == "^") {
          prec = Precedence::Bit;
        } else if (opcs == "<<" || opcs == ">>") {
          prec = Precedence::Shift;
        }
        return WrapBinary(args, opcs, false, prec);
      }
      case ExprType::Compare: {
        auto& ce = *cast<CompareExpr>(n.e);
        return WrapBinary(args, OpcodeToToken(ce.opcode), false,
                          Precedence::Equal);
      }
      case ExprType::Unary: {
        auto& ue = *cast<UnaryExpr>(n.e);
        // BracketIfNeeded(stack.back());
        // TODO: also version without () depending on precedence.
        return WrapChild(args[0], OpcodeToToken(ue.opcode) + "(", ")",
                         Precedence::Atomic);
      }
      case ExprType::Load: {
        auto& le = *cast<LoadExpr>(n.e);
        LoadStore(args[0], n.children[0], le.offset, le.opcode, le.align,
                  le.opcode.GetResultType());
        return std::move(args[0]);
      }
      case ExprType::Store: {
        auto& se = *cast<StoreExpr>(n.e);
        LoadStore(args[0], n.children[0], se.offset, se.opcode, se.align,
                  se.opcode.GetParamType2());
        return WrapBinary(args, "=", true, Precedence::Assign);
      }
      case ExprType::If: {
        auto ife = cast<IfExpr>(n.e);
        Value* elsep = nullptr;
        if (!ife->false_.empty()) {
          elsep = &args[2];
        }
        auto& thenp = args[1];
        auto& ifs = args[0];
        bool multiline = ifs.v.size() > 1 || thenp.v.size() > 1;
        size_t width = ifs.width() + thenp.width();
        if (elsep) {
          width += elsep->width();
          multiline = multiline || elsep->v.size() > 1;
        }
        multiline = multiline || width > target_exp_width;
        if (multiline) {
          auto if_start = std::string_view("if (");
          IndentValue(ifs, if_start.size(), if_start);
          ifs.v.back() += ") {";
          IndentValue(thenp, indent_amount, {});
          std::move(thenp.v.begin(), thenp.v.end(), std::back_inserter(ifs.v));
          if (elsep) {
            ifs.v.push_back("} else {");
            IndentValue(*elsep, indent_amount, {});
            std::move(elsep->v.begin(), elsep->v.end(),
                      std::back_inserter(ifs.v));
          }
          ifs.v.push_back("}");
          ifs.precedence = Precedence::If;
          return std::move(ifs);
        } else {
          auto s = cat("if (", ifs.v[0], ") {");
          if (!thenp.v.empty())
            s += cat(" ", thenp.v[0], " ");
          s += "}";
          if (elsep)
            s += cat(" else { ", elsep->v[0], " }");
          return Value{{std::move(s)}, Precedence::If};
        }
      }
      case ExprType::Block: {
        auto& val = args[0];
        val.v.push_back(
            cat("label ", VarName(cast<BlockExpr>(n.e)->block.label), ":"));
        // If this block is part of a larger statement scope, it doesn't
        // need its own indenting, but if its part of an exp we wrap it in {}.
        if (parent && parent->ntype != NodeType::Statements &&
            parent->etype != ExprType::Block &&
            parent->etype != ExprType::Loop &&
            (parent->etype != ExprType::If || &parent->children[0] == &n)) {
          IndentValue(val, indent_amount, {});
          val.v.insert(val.v.begin(), "{");
          val.v.push_back("}");
        }
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Loop: {
        auto& val = args[0];
        auto& block = cast<LoopExpr>(n.e)->block;
        IndentValue(val, indent_amount, {});
        val.v.insert(val.v.begin(), cat("loop ", VarName(block.label), " {"));
        val.v.push_back("}");
        val.precedence = Precedence::Atomic;
        return std::move(val);
      }
      case ExprType::Br: {
        auto be = cast<BrExpr>(n.e);
        return Value{{(n.u.lt == LabelType::Loop ? "continue " : "goto ") +
                      VarName(be->var.name())},
                     Precedence::None};
      }
      case ExprType::BrIf: {
        auto bie = cast<BrIfExpr>(n.e);
        auto jmp = n.u.lt == LabelType::Loop ? "continue" : "goto";
        return WrapChild(args[0], "if (",
                         cat(") ", jmp, " ", VarName(bie->var.name())),
                         Precedence::None);
      }
      case ExprType::Return: {
        return WrapNAry(args, "return ", "", Precedence::None);
      }
      case ExprType::Rethrow: {
        return WrapNAry(args, "rethrow ", "", Precedence::None);
      }
      case ExprType::Drop: {
        // Silent dropping of return values is very common, so currently
        // don't output this.
        return std::move(args[0]);
      }
      case ExprType::Nop: {
        return Value{{"nop"}, Precedence::None};
      }
      case ExprType::Unreachable: {
        return Value{{"unreachable"}, Precedence::None};
      }
      case ExprType::RefNull: {
        return Value{{"null"}, Precedence::Atomic};
      }
      case ExprType::BrTable: {
        auto bte = cast<BrTableExpr>(n.e);
        std::string ts = "br_table[";
        for (auto& v : bte->targets) {
          ts += VarName(v.name());
          ts += ", ";
        }
        ts += "..";
        ts += VarName(bte->default_target.name());
        ts += "](";
        return WrapChild(args[0], ts, ")", Precedence::Atomic);
      }
      case ExprType::CodeMetadata: {
        auto cme = cast<CodeMetadataExpr>(n.e);
        std::string c = "// @metadata.code." + cme->name + " ";
        c += BinaryToString(cme->data);
        return Value{{std::move(c)}, Precedence::None};
      }
      default: {
        // Everything that looks like a function call.
        std::string name;
        auto precedence = Precedence::Atomic;
        switch (n.etype) {
          case ExprType::Call:
            name = cast<CallExpr>(n.e)->var.name();
            break;
          case ExprType::ReturnCall:
            name = "return_call " + cast<ReturnCallExpr>(n.e)->var.name();
            precedence = Precedence::None;
            break;
          case ExprType::Convert:
            name = std::string(OpcodeToToken(cast<ConvertExpr>(n.e)->opcode));
            break;
          case ExprType::Ternary:
            name = std::string(OpcodeToToken(cast<TernaryExpr>(n.e)->opcode));
            break;
          case ExprType::Select:
            // This one looks like it could be translated to "?:" style ternary,
            // but the arguments are NOT lazy, and side effects definitely do
            // occur in the branches. So it has no clear equivalent in C-syntax.
            // To emphasize that all args are being evaluated in order, we
            // leave it as a function call.
            name = "select_if";
            break;
          case ExprType::MemoryGrow:
            name = "memory_grow";
            break;
          case ExprType::MemorySize:
            name = "memory_size";
            break;
          case ExprType::MemoryCopy:
            name = "memory_copy";
            break;
          case ExprType::MemoryFill:
            name = "memory_fill";
            break;
          case ExprType::RefIsNull:
            name = "is_null";
            break;
          case ExprType::CallIndirect:
            name = "call_indirect";
            break;
          case ExprType::ReturnCallIndirect:
            name = "return_call call_indirect";
            break;
          default:
            name = GetExprTypeName(n.etype);
            break;
        }
        return WrapNAry(args, name + "(", ")", precedence);
      }
    }
  }